

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_seqDecompressedSize(seqDef *sequences,size_t nbSeq,size_t litSize)

{
  long lVar1;
  long lVar2;
  seqDef *sstart;
  U16 *pUVar3;
  
  pUVar3 = &sequences->matchLength;
  lVar1 = 0;
  for (lVar2 = nbSeq << 3; 0 < lVar2; lVar2 = lVar2 + -8) {
    lVar1 = lVar1 + (ulong)*pUVar3 + 3;
    pUVar3 = pUVar3 + 4;
  }
  return lVar1 + litSize;
}

Assistant:

static size_t ZSTD_seqDecompressedSize(const seqDef* sequences, size_t nbSeq, size_t litSize) {
    const seqDef* const sstart = sequences;
    const seqDef* const send = sequences + nbSeq;
    const seqDef* sp = sstart;
    size_t matchLengthSum = 0;
    while (send-sp > 0) {
      matchLengthSum += sp->matchLength + MINMATCH;
      sp++;
    }
    return matchLengthSum + litSize;
}